

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImGuiNextWindowDataFlags IVar1;
  ImVec2 p_min;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID seed;
  ImGuiWindow *pIVar4;
  uint in_EDX;
  long in_RSI;
  float _x;
  float _x_00;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImU32 text_col;
  ImU32 bg_col;
  float value_x2;
  ImU32 frame_col;
  bool popup_open;
  ImGuiID popup_id;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImRect bb;
  float w;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiNextWindowDataFlags backup_next_window_data_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffe88;
  ImRect *in_stack_fffffffffffffe90;
  ImDrawList *in_stack_fffffffffffffe98;
  ImDrawList *in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 uVar7;
  ImGuiWindow *in_stack_fffffffffffffeb0;
  ImRect *in_stack_fffffffffffffeb8;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffec8;
  undefined1 hide_text_after_hash;
  ImVec2 *this_00;
  ImVec2 *min;
  ImVec2 p_max;
  float fVar8;
  float id_00;
  ImVec2 in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float popup_id_00;
  ImRect *in_stack_ffffffffffffff10;
  ImVec2 local_e8;
  ImVec2 local_e0;
  undefined8 in_stack_ffffffffffffff28;
  ImRect *in_stack_ffffffffffffff30;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImU32 local_b8;
  ImU32 local_b4;
  ImVec2 local_b0;
  float local_a8;
  ImU32 local_a4;
  bool local_9d;
  ImGuiID local_9c;
  byte local_97;
  undefined1 local_95;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImRect local_84;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float fVar9;
  float fVar10;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float fStack_58;
  float local_50;
  float fStack_4c;
  long local_18;
  bool local_1;
  
  pIVar2 = GImGui;
  pIVar4 = GetCurrentWindow();
  IVar1 = (pIVar2->NextWindowData).Flags;
  ImGuiNextWindowData::ClearFlags(&pIVar2->NextWindowData);
  if ((pIVar4->SkipItems & 1U) == 0) {
    seed = ImGuiWindow::GetID(in_stack_fffffffffffffeb0,
                              (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              (char *)in_stack_fffffffffffffea0);
    if ((in_EDX & 0x20) == 0) {
      fVar8 = GetFrameHeight();
    }
    else {
      fVar8 = 0.0;
    }
    id_00 = fVar8;
    IVar5 = CalcTextSize((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                         SUB41((uint)in_stack_fffffffffffffeac >> 0x18,0),in_stack_fffffffffffffea8)
    ;
    _x = fVar8;
    if ((in_EDX & 0x40) == 0) {
      _x = CalcItemWidth();
    }
    min = &(pIVar4->DC).CursorPos;
    fStack_4c = IVar5.y;
    fVar9 = (pIVar2->Style).FramePadding.y;
    this_00 = (ImVec2 *)&stack0xffffffffffffff8c;
    ImVec2::ImVec2(this_00,_x,fVar9 + fVar9 + fStack_4c);
    IVar6 = ::operator+(in_stack_fffffffffffffe88,(ImVec2 *)0x4f7f7a);
    fVar9 = IVar6.x;
    fVar10 = IVar6.y;
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff9c,min,(ImVec2 *)&stack0xffffffffffffff94);
    IVar6 = (ImVec2)&stack0xffffffffffffff9c;
    p_max = (ImVec2)&stack0xffffffffffffffa4;
    local_50 = IVar5.x;
    if (local_50 <= 0.0) {
      _x_00 = 0.0;
    }
    else {
      _x_00 = (pIVar2->Style).ItemInnerSpacing.x + local_50;
    }
    this = &local_94;
    ImVec2::ImVec2(this,_x_00,0.0);
    local_8c = ::operator+(in_stack_fffffffffffffe88,(ImVec2 *)0x4f801f);
    ImRect::ImRect(&local_84,(ImVec2 *)IVar6,&local_8c);
    ItemSize(in_stack_fffffffffffffe90,(float)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    bVar3 = ItemAdd(in_stack_fffffffffffffeb8,(ImGuiID)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                    (ImRect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                    (ImGuiItemFlags)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    if (bVar3) {
      local_97 = ButtonBehavior(in_stack_ffffffffffffff10,(ImGuiID)in_stack_ffffffffffffff0c,
                                (bool *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00
                                                ),(bool *)in_stack_fffffffffffffef8,
                                (ImGuiButtonFlags)id_00);
      popup_id_00 = SUB84(in_stack_ffffffffffffff10,0);
      local_9c = ImHashStr("##ComboPopup",0,seed);
      local_9d = IsPopupOpen((ImGuiID)in_stack_fffffffffffffea0,
                             (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffe98 >> 0x20));
      if (((local_97 & 1) != 0) && (!local_9d)) {
        OpenPopupEx((ImGuiID)id_00,(ImGuiPopupFlags)_x);
        local_9d = true;
      }
      local_a4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                             SUB84(in_stack_fffffffffffffea0,0));
      local_a8 = ImMax<float>(in_stack_ffffffffffffff9c,in_stack_ffffffffffffffa4 - fVar8);
      RenderNavHighlight(in_stack_ffffffffffffff30,
                         (ImGuiID)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                         (ImGuiNavHighlightFlags)in_stack_ffffffffffffff28);
      if ((in_EDX & 0x40) == 0) {
        in_stack_fffffffffffffeb0 = (ImGuiWindow *)pIVar4->DrawList;
        in_stack_fffffffffffffeb8 = (ImRect *)&stack0xffffffffffffff9c;
        ImVec2::ImVec2(&local_b0,local_a8,fStack_58);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffeb0,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (ImVec2 *)in_stack_fffffffffffffea0,
                   (ImU32)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   SUB84(in_stack_fffffffffffffe98,0),
                   (ImDrawFlags)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      }
      if ((in_EDX & 0x20) == 0) {
        uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffeac);
        if ((local_9d & 1U) == 0) {
          uVar7 = CONCAT13(local_95,(int3)in_stack_fffffffffffffeac);
        }
        local_b4 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                               SUB84(in_stack_fffffffffffffea0,0));
        local_b8 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                               SUB84(in_stack_fffffffffffffea0,0));
        in_stack_fffffffffffffea0 = pIVar4->DrawList;
        ImVec2::ImVec2(&local_c0,local_a8,in_stack_ffffffffffffffa0);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffeb0,
                   (ImVec2 *)CONCAT44(uVar7,in_stack_fffffffffffffea8),
                   (ImVec2 *)in_stack_fffffffffffffea0,
                   (ImU32)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                   SUB84(in_stack_fffffffffffffe98,0),
                   (ImDrawFlags)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        if ((local_a8 + fVar8) - (pIVar2->Style).FramePadding.x <= in_stack_ffffffffffffffa4) {
          in_stack_fffffffffffffe98 = pIVar4->DrawList;
          fVar8 = (pIVar2->Style).FramePadding.y;
          ImVec2::ImVec2(&local_c8,local_a8 + fVar8,in_stack_ffffffffffffffa0 + fVar8);
          IVar5.y = in_stack_ffffffffffffffa4;
          IVar5.x = in_stack_ffffffffffffffa0;
          RenderArrow((ImDrawList *)CONCAT44(in_stack_ffffffffffffff9c,fVar10),IVar5,(ImU32)fVar9,
                      (ImGuiDir)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
      }
      p_min.y = id_00;
      p_min.x = _x;
      RenderFrameBorder(p_min,p_max,IVar6.y);
      local_18 = in_RSI;
      if ((in_EDX & 0x100000) != 0) {
        ImRect::ImRect((ImRect *)in_stack_fffffffffffffea0,
                       (float)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                       SUB84(in_stack_fffffffffffffe98,0),
                       (float)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       SUB84(in_stack_fffffffffffffe90,0));
        (pIVar2->ComboPreviewData).PreviewRect.Min = local_e8;
        (pIVar2->ComboPreviewData).PreviewRect.Max = local_e0;
        local_18 = 0;
      }
      if ((local_18 != 0) && ((in_EDX & 0x40) == 0)) {
        if ((pIVar2->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        IVar5 = ::operator+(in_stack_fffffffffffffe88,(ImVec2 *)0x4f84cb);
        popup_id_00 = IVar5.x;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff08,local_a8,fStack_58);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff00,0.0,0.0);
        RenderTextClipped((ImVec2 *)IVar6,min,(char *)this_00,
                          (char *)CONCAT44(_x_00,in_stack_fffffffffffffec8),this,
                          &in_stack_fffffffffffffeb8->Min,(ImRect *)CONCAT44(id_00,_x));
      }
      hide_text_after_hash = (undefined1)((uint)_x_00 >> 0x18);
      if (0.0 < local_50) {
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffef8,
                       in_stack_ffffffffffffffa4 + (pIVar2->Style).ItemInnerSpacing.x,
                       in_stack_ffffffffffffffa0 + (pIVar2->Style).FramePadding.y);
        RenderText(IVar6,(char *)min,(char *)this_00,(bool)hide_text_after_hash);
      }
      if ((local_9d & 1U) == 0) {
        local_1 = false;
      }
      else {
        (pIVar2->NextWindowData).Flags = IVar1;
        local_1 = BeginComboPopup((ImGuiID)popup_id_00,
                                  (ImRect *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  (ImGuiComboFlags)in_stack_ffffffffffffff04);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if (pressed && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Custom preview
    if (flags & ImGuiComboFlags_CustomPreview)
    {
        g.ComboPreviewData.PreviewRect = ImRect(bb.Min.x, bb.Min.y, value_x2, bb.Max.y);
        IM_ASSERT(preview_value == NULL || preview_value[0] == 0);
        preview_value = NULL;
    }

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}